

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# leakagemodel.cpp
# Opt level: O2

double __thiscall
FavadLeakageModel::findFlow
          (FavadLeakageModel *this,double a,double m,double length,double h,double *dqdh)

{
  double dVar1;
  double dVar2;
  double dVar3;
  
  dVar3 = 0.0;
  dVar1 = 0.0;
  if (0.0 < h) {
    dVar1 = (this->super_LeakageModel).lengthUcf;
    dVar3 = pow(h,0.5);
    dVar2 = (dVar3 * (a / dVar1) * 4.814976635457332 * length) / 1000.0;
    dVar1 = pow(h,1.5);
    dVar1 = (dVar1 * m * 4.814976635457332 * length) / 1000.0;
    dVar3 = ((dVar2 * 0.5 + dVar1 * 1.5) / h) * 0.5;
    dVar1 = dVar1 + dVar2;
  }
  *dqdh = dVar3;
  return dVar1;
}

Assistant:

double FavadLeakageModel::findFlow(double a, double m, double length, double h,
                                   double& dqdh)
{
    // no leakage for non-positive pressure head
    if ( h <= 0.0 )
    {
        dqdh = 0.0;
        return 0.0;
    }

    // 'a' is leak area per 1000 pipe length units,
    // 'm' is change in 'a' per change in head (dimensionless),
    // convert 'a' to ft2 / 1000 ft
    a /= lengthUcf;

    // compute fixed & variable head portions of leakage in cfs
    // (C is orifice constant, 0.6 * sqrt(2g))
    double q1 = a * C * pow(h, 0.5) * length / 1000.0;
    double q2 = m * C * pow(h, 1.5) * length / 1000.0;

    // find half-gradient of leakage flow
    dqdh = (0.5 * q1 + 1.5 * q2) / h / 2.0;

    // return total leakage flow rate
    return q1 + q2;
}